

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

_Bool seq_from(Env *env,char *s,uint32_t start)

{
  char cVar1;
  int32_t iVar2;
  size_t sVar3;
  int32_t c2;
  int32_t c;
  uint32_t i;
  uint32_t len;
  uint32_t start_local;
  char *s_local;
  Env *env_local;
  
  sVar3 = strlen(s);
  c2 = 0;
  while( true ) {
    if ((uint)sVar3 <= (uint)c2) {
      peek(env,start + (uint)sVar3);
      return true;
    }
    cVar1 = s[(uint)c2];
    iVar2 = peek(env,start + c2);
    if (cVar1 != iVar2) break;
    c2 = c2 + 1;
  }
  return false;
}

Assistant:

static bool seq_from(Env *env, const char *restrict s, uint32_t start) {
  uint32_t len = (uint32_t) strlen(s);
  for (uint32_t i = 0; i < len; i++) {
    int32_t c = s[i];
    int32_t c2 = peek(env, start + i);
    if (c != c2) return false;
  }
  peek(env, start + len);
  return true;
}